

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::BVHNIntersector1<8,_1,_true,_embree::avx2::SubGridIntersector1Pluecker<8,_true>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  Geometry *pGVar10;
  RTCFilterFunctionN p_Var11;
  RTCRayQueryContext *pRVar12;
  undefined1 auVar13 [32];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  uint uVar53;
  uint uVar54;
  ulong uVar55;
  ulong uVar56;
  undefined1 (*pauVar57) [16];
  long lVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  long lVar63;
  long lVar64;
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  undefined1 (*pauVar68) [16];
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  long lVar72;
  ulong uVar73;
  undefined4 uVar74;
  float fVar75;
  float fVar81;
  float fVar82;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  float fVar83;
  undefined1 auVar80 [32];
  float fVar84;
  float fVar90;
  float fVar91;
  undefined1 auVar85 [16];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar92;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  float fVar104;
  undefined1 auVar99 [32];
  float fVar111;
  undefined8 uVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  __m128 a;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [64];
  float fVar157;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar172 [32];
  undefined1 auVar173 [64];
  undefined1 auVar174 [64];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2a21;
  ulong local_2a20;
  RayQueryContext *local_2a18;
  ulong local_2a10;
  uint local_2a08;
  int local_2a04;
  ulong local_2a00;
  ulong local_29f8;
  ulong local_29f0;
  ulong local_29e8;
  ulong local_29e0;
  ulong local_29d8;
  ulong local_29d0;
  long local_29c8;
  long local_29c0;
  ulong local_29b8;
  ulong local_29b0;
  ulong local_29a8;
  ulong local_29a0;
  ulong local_2998;
  undefined1 (*local_2990) [16];
  long local_2988;
  Scene *local_2980;
  ulong local_2978;
  RTCFilterFunctionNArguments local_2970;
  undefined1 local_2940 [8];
  float fStack_2938;
  float fStack_2934;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  float fStack_2924;
  undefined1 local_2920 [32];
  float local_28f0;
  float local_28ec;
  float local_28e8;
  undefined4 local_28e4;
  undefined4 local_28e0;
  undefined4 local_28dc;
  undefined4 local_28d8;
  uint local_28d4;
  uint local_28d0;
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 *local_2760;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  float local_26c0 [4];
  float fStack_26b0;
  float fStack_26ac;
  float fStack_26a8;
  undefined4 uStack_26a4;
  float local_26a0 [4];
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  undefined4 uStack_2684;
  float local_2680 [4];
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  float local_2620;
  float fStack_261c;
  float fStack_2618;
  float fStack_2614;
  float fStack_2610;
  float fStack_260c;
  float fStack_2608;
  float fStack_2604;
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [8];
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 == 8) {
    return;
  }
  pauVar68 = (undefined1 (*) [16])local_2390;
  uStack_2398 = 0;
  aVar1 = (ray->super_RayK<1>).dir.field_0;
  auVar76 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
  auVar85 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
  auVar117._8_4_ = 0x7fffffff;
  auVar117._0_8_ = 0x7fffffff7fffffff;
  auVar117._12_4_ = 0x7fffffff;
  auVar117 = vandps_avx((undefined1  [16])aVar1,auVar117);
  auVar129._8_4_ = 0x219392ef;
  auVar129._0_8_ = 0x219392ef219392ef;
  auVar129._12_4_ = 0x219392ef;
  auVar117 = vcmpps_avx(auVar117,auVar129,1);
  auVar130._8_4_ = 0x3f800000;
  auVar130._0_8_ = 0x3f8000003f800000;
  auVar130._12_4_ = 0x3f800000;
  auVar129 = vdivps_avx(auVar130,(undefined1  [16])aVar1);
  auVar131._8_4_ = 0x5d5e0b6b;
  auVar131._0_8_ = 0x5d5e0b6b5d5e0b6b;
  auVar131._12_4_ = 0x5d5e0b6b;
  auVar117 = vblendvps_avx(auVar129,auVar131,auVar117);
  auVar118._0_4_ = auVar117._0_4_ * 0.99999964;
  auVar118._4_4_ = auVar117._4_4_ * 0.99999964;
  auVar118._8_4_ = auVar117._8_4_ * 0.99999964;
  auVar118._12_4_ = auVar117._12_4_ * 0.99999964;
  auVar113._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar113._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar113._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar113._12_4_ = auVar117._12_4_ * 1.0000004;
  uVar74 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
  local_25e0._4_4_ = uVar74;
  local_25e0._0_4_ = uVar74;
  local_25e0._8_4_ = uVar74;
  local_25e0._12_4_ = uVar74;
  local_25e0._16_4_ = uVar74;
  local_25e0._20_4_ = uVar74;
  local_25e0._24_4_ = uVar74;
  local_25e0._28_4_ = uVar74;
  uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
  local_2600._4_4_ = uVar74;
  local_2600._0_4_ = uVar74;
  local_2600._8_4_ = uVar74;
  local_2600._12_4_ = uVar74;
  local_2600._16_4_ = uVar74;
  local_2600._20_4_ = uVar74;
  local_2600._24_4_ = uVar74;
  local_2600._28_4_ = uVar74;
  uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
  local_2540._4_4_ = uVar74;
  local_2540._0_4_ = uVar74;
  local_2540._8_4_ = uVar74;
  local_2540._12_4_ = uVar74;
  local_2540._16_4_ = uVar74;
  local_2540._20_4_ = uVar74;
  local_2540._24_4_ = uVar74;
  local_2540._28_4_ = uVar74;
  auVar168 = ZEXT3264(local_2540);
  auVar117 = vmovshdup_avx(auVar118);
  uVar112 = auVar117._0_8_;
  local_2640._8_8_ = uVar112;
  local_2640._0_8_ = uVar112;
  local_2640._16_8_ = uVar112;
  local_2640._24_8_ = uVar112;
  auVar130 = vshufpd_avx(auVar118,auVar118,1);
  auVar129 = vshufps_avx(auVar118,auVar118,0xaa);
  uVar112 = auVar129._0_8_;
  local_2560._8_8_ = uVar112;
  local_2560._0_8_ = uVar112;
  local_2560._16_8_ = uVar112;
  local_2560._24_8_ = uVar112;
  auVar173 = ZEXT3264(local_2560);
  local_2660._4_4_ = auVar113._0_4_;
  local_2660._0_4_ = auVar113._0_4_;
  local_2660._8_4_ = auVar113._0_4_;
  local_2660._12_4_ = auVar113._0_4_;
  local_2660._16_4_ = auVar113._0_4_;
  local_2660._20_4_ = auVar113._0_4_;
  local_2660._24_4_ = auVar113._0_4_;
  local_2660._28_4_ = auVar113._0_4_;
  auVar129 = vmovshdup_avx(auVar113);
  uVar112 = auVar129._0_8_;
  local_2580._8_8_ = uVar112;
  local_2580._0_8_ = uVar112;
  local_2580._16_8_ = uVar112;
  local_2580._24_8_ = uVar112;
  auVar176 = ZEXT3264(local_2580);
  auVar128 = ZEXT3264(local_2660);
  auVar129 = vshufps_avx(auVar113,auVar113,0xaa);
  uVar62 = (ulong)(auVar118._0_4_ < 0.0) << 5;
  auVar140 = ZEXT3264(local_2600);
  auVar156 = ZEXT3264(local_2640);
  uVar69 = (ulong)(auVar117._0_4_ < 0.0) << 5 | 0x40;
  auVar145 = ZEXT3264(local_25e0);
  uVar112 = auVar129._0_8_;
  local_2860._8_8_ = uVar112;
  local_2860._0_8_ = uVar112;
  local_2860._16_8_ = uVar112;
  local_2860._24_8_ = uVar112;
  auVar171 = ZEXT3264(local_2860);
  uVar61 = (ulong)(auVar130._0_4_ < 0.0) << 5 | 0x80;
  uVar73 = uVar62 ^ 0x20;
  uVar71 = uVar69 ^ 0x20;
  uVar67 = uVar61 ^ 0x20;
  uVar74 = auVar76._0_4_;
  local_2880._4_4_ = uVar74;
  local_2880._0_4_ = uVar74;
  local_2880._8_4_ = uVar74;
  local_2880._12_4_ = uVar74;
  local_2880._16_4_ = uVar74;
  local_2880._20_4_ = uVar74;
  local_2880._24_4_ = uVar74;
  local_2880._28_4_ = uVar74;
  auVar174 = ZEXT3264(local_2880);
  uVar74 = auVar85._0_4_;
  local_28a0._4_4_ = uVar74;
  local_28a0._0_4_ = uVar74;
  local_28a0._8_4_ = uVar74;
  local_28a0._12_4_ = uVar74;
  local_28a0._16_4_ = uVar74;
  local_28a0._20_4_ = uVar74;
  local_28a0._24_4_ = uVar74;
  local_28a0._28_4_ = uVar74;
  local_29d0 = (ulong)(((uint)(auVar118._0_4_ < 0.0) << 5) >> 2);
  local_29d8 = uVar73 >> 2;
  local_29e0 = uVar69 >> 2;
  local_29e8 = uVar71 >> 2;
  local_27e0._16_16_ = mm_lookupmask_ps._240_16_;
  local_27e0._0_16_ = mm_lookupmask_ps._240_16_;
  local_29f0 = uVar61 >> 2;
  local_25a0 = vperm2f128_avx(local_27e0,mm_lookupmask_ps._0_32_,2);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar96._16_4_ = 0x3f800000;
  auVar96._20_4_ = 0x3f800000;
  auVar96._24_4_ = 0x3f800000;
  auVar96._28_4_ = 0x3f800000;
  auVar124._8_4_ = 0xbf800000;
  auVar124._0_8_ = 0xbf800000bf800000;
  auVar124._12_4_ = 0xbf800000;
  auVar124._16_4_ = 0xbf800000;
  auVar124._20_4_ = 0xbf800000;
  auVar124._24_4_ = 0xbf800000;
  auVar124._28_4_ = 0xbf800000;
  _local_25c0 = vblendvps_avx(auVar96,auVar124,local_25a0);
  local_29f8 = uVar67 >> 2;
  local_2998 = uVar62;
  local_2620 = auVar118._0_4_;
  fStack_261c = auVar118._0_4_;
  fStack_2618 = auVar118._0_4_;
  fStack_2614 = auVar118._0_4_;
  fStack_2610 = auVar118._0_4_;
  fStack_260c = auVar118._0_4_;
  fStack_2608 = auVar118._0_4_;
  fStack_2604 = auVar118._0_4_;
  local_29a0 = uVar69;
  local_29a8 = uVar61;
  local_29b0 = uVar73;
  local_29b8 = uVar71;
  fVar110 = auVar118._0_4_;
  fVar94 = auVar118._0_4_;
  fVar101 = auVar118._0_4_;
  fVar103 = auVar118._0_4_;
  fVar105 = auVar118._0_4_;
  fVar107 = auVar118._0_4_;
  local_2a20 = uVar67;
  local_2a18 = context;
  do {
LAB_0153c989:
    do {
      if (pauVar68 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar57 = pauVar68 + -1;
      pauVar68 = pauVar68 + -1;
    } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar57 + 8));
    uVar59 = *(ulong *)*pauVar68;
LAB_0153c9af:
    if ((uVar59 & 8) == 0) {
      auVar124 = vsubps_avx(*(undefined1 (*) [32])(uVar59 + 0x40 + uVar62),auVar145._0_32_);
      auVar13._4_4_ = fVar110 * auVar124._4_4_;
      auVar13._0_4_ = auVar118._0_4_ * auVar124._0_4_;
      auVar13._8_4_ = fVar94 * auVar124._8_4_;
      auVar13._12_4_ = fVar101 * auVar124._12_4_;
      auVar13._16_4_ = fVar103 * auVar124._16_4_;
      auVar13._20_4_ = fVar105 * auVar124._20_4_;
      auVar13._24_4_ = fVar107 * auVar124._24_4_;
      auVar13._28_4_ = auVar124._28_4_;
      auVar134 = auVar140._0_32_;
      auVar124 = vsubps_avx(*(undefined1 (*) [32])(uVar59 + 0x40 + uVar69),auVar134);
      auVar24._4_4_ = auVar156._4_4_ * auVar124._4_4_;
      auVar24._0_4_ = auVar156._0_4_ * auVar124._0_4_;
      auVar24._8_4_ = auVar156._8_4_ * auVar124._8_4_;
      auVar24._12_4_ = auVar156._12_4_ * auVar124._12_4_;
      auVar24._16_4_ = auVar156._16_4_ * auVar124._16_4_;
      auVar24._20_4_ = auVar156._20_4_ * auVar124._20_4_;
      auVar24._24_4_ = auVar156._24_4_ * auVar124._24_4_;
      auVar24._28_4_ = auVar124._28_4_;
      auVar124 = vmaxps_avx(auVar13,auVar24);
      auVar96 = vsubps_avx(*(undefined1 (*) [32])(uVar59 + 0x40 + uVar61),auVar168._0_32_);
      auVar116._4_4_ = auVar173._4_4_ * auVar96._4_4_;
      auVar116._0_4_ = auVar173._0_4_ * auVar96._0_4_;
      auVar116._8_4_ = auVar173._8_4_ * auVar96._8_4_;
      auVar116._12_4_ = auVar173._12_4_ * auVar96._12_4_;
      auVar116._16_4_ = auVar173._16_4_ * auVar96._16_4_;
      auVar116._20_4_ = auVar173._20_4_ * auVar96._20_4_;
      auVar116._24_4_ = auVar173._24_4_ * auVar96._24_4_;
      auVar116._28_4_ = auVar96._28_4_;
      auVar96 = vsubps_avx(*(undefined1 (*) [32])(uVar59 + 0x40 + uVar73),auVar145._0_32_);
      auVar26._4_4_ = auVar128._4_4_ * auVar96._4_4_;
      auVar26._0_4_ = auVar128._0_4_ * auVar96._0_4_;
      auVar26._8_4_ = auVar128._8_4_ * auVar96._8_4_;
      auVar26._12_4_ = auVar128._12_4_ * auVar96._12_4_;
      auVar26._16_4_ = auVar128._16_4_ * auVar96._16_4_;
      auVar26._20_4_ = auVar128._20_4_ * auVar96._20_4_;
      auVar26._24_4_ = auVar128._24_4_ * auVar96._24_4_;
      auVar26._28_4_ = auVar96._28_4_;
      auVar96 = vsubps_avx(*(undefined1 (*) [32])(uVar59 + 0x40 + uVar71),auVar134);
      auVar25._4_4_ = auVar176._4_4_ * auVar96._4_4_;
      auVar25._0_4_ = auVar176._0_4_ * auVar96._0_4_;
      auVar25._8_4_ = auVar176._8_4_ * auVar96._8_4_;
      auVar25._12_4_ = auVar176._12_4_ * auVar96._12_4_;
      auVar25._16_4_ = auVar176._16_4_ * auVar96._16_4_;
      auVar25._20_4_ = auVar176._20_4_ * auVar96._20_4_;
      auVar25._24_4_ = auVar176._24_4_ * auVar96._24_4_;
      auVar25._28_4_ = auVar96._28_4_;
      auVar13 = vminps_avx(auVar26,auVar25);
      auVar96 = vsubps_avx(*(undefined1 (*) [32])(uVar59 + 0x40 + uVar67),auVar168._0_32_);
      auVar125._4_4_ = auVar171._4_4_ * auVar96._4_4_;
      auVar125._0_4_ = auVar171._0_4_ * auVar96._0_4_;
      auVar125._8_4_ = auVar171._8_4_ * auVar96._8_4_;
      auVar125._12_4_ = auVar171._12_4_ * auVar96._12_4_;
      auVar125._16_4_ = auVar171._16_4_ * auVar96._16_4_;
      auVar125._20_4_ = auVar171._20_4_ * auVar96._20_4_;
      auVar125._24_4_ = auVar171._24_4_ * auVar96._24_4_;
      auVar125._28_4_ = auVar96._28_4_;
      auVar96 = vmaxps_avx(auVar116,auVar174._0_32_);
      local_27c0 = vmaxps_avx(auVar124,auVar96);
      auVar124 = vminps_avx(auVar125,local_28a0);
      auVar124 = vminps_avx(auVar13,auVar124);
      auVar124 = vcmpps_avx(local_27c0,auVar124,2);
      uVar53 = vmovmskps_avx(auVar124);
      if (uVar53 != 0) {
        uVar53 = uVar53 & 0xff;
        uVar70 = uVar59 & 0xfffffffffffffff0;
        lVar60 = 0;
        for (uVar59 = (ulong)uVar53; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
          lVar60 = lVar60 + 1;
        }
        uVar59 = *(ulong *)(uVar70 + lVar60 * 8);
        uVar53 = uVar53 - 1 & uVar53;
        uVar55 = (ulong)uVar53;
        if (uVar53 != 0) {
          uVar54 = *(uint *)(local_27c0 + lVar60 * 4);
          lVar60 = 0;
          for (; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000) {
            lVar60 = lVar60 + 1;
          }
          uVar53 = uVar53 - 1 & uVar53;
          uVar56 = (ulong)uVar53;
          uVar55 = *(ulong *)(uVar70 + lVar60 * 8);
          uVar66 = *(uint *)(local_27c0 + lVar60 * 4);
          uVar67 = local_2a20;
          if (uVar53 == 0) {
            if (uVar54 < uVar66) {
              *(ulong *)*pauVar68 = uVar55;
              *(uint *)(*pauVar68 + 8) = uVar66;
              pauVar68 = pauVar68 + 1;
            }
            else {
              *(ulong *)*pauVar68 = uVar59;
              *(uint *)(*pauVar68 + 8) = uVar54;
              pauVar68 = pauVar68 + 1;
              uVar59 = uVar55;
            }
          }
          else {
            auVar76._8_8_ = 0;
            auVar76._0_8_ = uVar59;
            auVar117 = vpunpcklqdq_avx(auVar76,ZEXT416(uVar54));
            auVar85._8_8_ = 0;
            auVar85._0_8_ = uVar55;
            auVar129 = vpunpcklqdq_avx(auVar85,ZEXT416(uVar66));
            lVar60 = 0;
            for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
              lVar60 = lVar60 + 1;
            }
            uVar53 = uVar53 - 1 & uVar53;
            uVar59 = (ulong)uVar53;
            auVar95._8_8_ = 0;
            auVar95._0_8_ = *(ulong *)(uVar70 + lVar60 * 8);
            auVar85 = vpunpcklqdq_avx(auVar95,ZEXT416(*(uint *)(local_27c0 + lVar60 * 4)));
            auVar76 = vpcmpgtd_avx(auVar129,auVar117);
            if (uVar53 == 0) {
              auVar130 = vpshufd_avx(auVar76,0xaa);
              auVar76 = vblendvps_avx(auVar129,auVar117,auVar130);
              auVar117 = vblendvps_avx(auVar117,auVar129,auVar130);
              auVar129 = vpcmpgtd_avx(auVar85,auVar76);
              auVar130 = vpshufd_avx(auVar129,0xaa);
              auVar129 = vblendvps_avx(auVar85,auVar76,auVar130);
              auVar76 = vblendvps_avx(auVar76,auVar85,auVar130);
              auVar85 = vpcmpgtd_avx(auVar76,auVar117);
              auVar130 = vpshufd_avx(auVar85,0xaa);
              auVar85 = vblendvps_avx(auVar76,auVar117,auVar130);
              auVar117 = vblendvps_avx(auVar117,auVar76,auVar130);
              *pauVar68 = auVar117;
              pauVar68[1] = auVar85;
              uVar59 = auVar129._0_8_;
              pauVar68 = pauVar68 + 2;
              auVar128 = ZEXT3264(auVar128._0_32_);
            }
            else {
              lVar60 = 0;
              for (; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
                lVar60 = lVar60 + 1;
              }
              uVar53 = uVar53 - 1 & uVar53;
              uVar59 = (ulong)uVar53;
              auVar119._8_8_ = 0;
              auVar119._0_8_ = *(ulong *)(uVar70 + lVar60 * 8);
              auVar130 = vpunpcklqdq_avx(auVar119,ZEXT416(*(uint *)(local_27c0 + lVar60 * 4)));
              if (uVar53 == 0) {
                auVar113 = vpshufd_avx(auVar76,0xaa);
                auVar76 = vblendvps_avx(auVar129,auVar117,auVar113);
                auVar117 = vblendvps_avx(auVar117,auVar129,auVar113);
                auVar129 = vpcmpgtd_avx(auVar130,auVar85);
                auVar113 = vpshufd_avx(auVar129,0xaa);
                auVar129 = vblendvps_avx(auVar130,auVar85,auVar113);
                auVar85 = vblendvps_avx(auVar85,auVar130,auVar113);
                auVar130 = vpcmpgtd_avx(auVar85,auVar117);
                auVar113 = vpshufd_avx(auVar130,0xaa);
                auVar130 = vblendvps_avx(auVar85,auVar117,auVar113);
                auVar117 = vblendvps_avx(auVar117,auVar85,auVar113);
                auVar85 = vpcmpgtd_avx(auVar129,auVar76);
                auVar113 = vpshufd_avx(auVar85,0xaa);
                auVar85 = vblendvps_avx(auVar129,auVar76,auVar113);
                auVar129 = vblendvps_avx(auVar76,auVar129,auVar113);
                auVar76 = vpcmpgtd_avx(auVar130,auVar129);
                auVar113 = vpshufd_avx(auVar76,0xaa);
                auVar76 = vblendvps_avx(auVar130,auVar129,auVar113);
                auVar129 = vblendvps_avx(auVar129,auVar130,auVar113);
                *pauVar68 = auVar117;
                pauVar68[1] = auVar129;
                pauVar68[2] = auVar76;
                uVar59 = auVar85._0_8_;
                pauVar57 = pauVar68 + 3;
              }
              else {
                *pauVar68 = auVar117;
                pauVar68[1] = auVar129;
                pauVar68[2] = auVar85;
                pauVar57 = pauVar68 + 3;
                pauVar68[3] = auVar130;
                do {
                  lVar60 = 0;
                  for (uVar55 = uVar59; (uVar55 & 1) == 0; uVar55 = uVar55 >> 1 | 0x8000000000000000
                      ) {
                    lVar60 = lVar60 + 1;
                  }
                  auVar77._8_8_ = 0;
                  auVar77._0_8_ = *(ulong *)(uVar70 + lVar60 * 8);
                  auVar117 = vpunpcklqdq_avx(auVar77,ZEXT416(*(uint *)(local_27c0 + lVar60 * 4)));
                  pauVar57[1] = auVar117;
                  pauVar57 = pauVar57 + 1;
                  uVar59 = uVar59 - 1 & uVar59;
                } while (uVar59 != 0);
                lVar60 = 0;
                while (pauVar57 != pauVar68) {
                  auVar117 = pauVar68[1];
                  uVar53 = vextractps_avx(auVar117,2);
                  for (lVar63 = 0x10;
                      (lVar60 != lVar63 && (*(uint *)(pauVar68[-1] + lVar63 + 8) < uVar53));
                      lVar63 = lVar63 + -0x10) {
                    *(undefined1 (*) [16])(*pauVar68 + lVar63) =
                         *(undefined1 (*) [16])(pauVar68[-1] + lVar63);
                  }
                  *(undefined1 (*) [16])(*pauVar68 + lVar63) = auVar117;
                  lVar60 = lVar60 + -0x10;
                  pauVar68 = pauVar68 + 1;
                }
                uVar59 = *(ulong *)*pauVar57;
                auVar171 = ZEXT3264(local_2860);
                auVar174 = ZEXT3264(local_2880);
                context = local_2a18;
              }
              auVar140 = ZEXT3264(auVar134);
              auVar128 = ZEXT3264(auVar128._0_32_);
              pauVar68 = pauVar57;
            }
          }
        }
        goto LAB_0153c9af;
      }
      goto LAB_0153c989;
    }
    local_29c8 = (ulong)((uint)uVar59 & 0xf) - 8;
    uVar59 = uVar59 & 0xfffffffffffffff0;
    local_2990 = pauVar68;
    for (local_29c0 = 0; local_29c0 != local_29c8; local_29c0 = local_29c0 + 1) {
      lVar60 = local_29c0 * 0x90;
      uVar74 = *(undefined4 *)(uVar59 + 0x70 + lVar60);
      auVar97._4_4_ = uVar74;
      auVar97._0_4_ = uVar74;
      auVar97._8_4_ = uVar74;
      auVar97._12_4_ = uVar74;
      auVar97._16_4_ = uVar74;
      auVar97._20_4_ = uVar74;
      auVar97._24_4_ = uVar74;
      auVar97._28_4_ = uVar74;
      uVar74 = *(undefined4 *)(uVar59 + 0x7c + lVar60);
      auVar114._4_4_ = uVar74;
      auVar114._0_4_ = uVar74;
      auVar114._8_4_ = uVar74;
      auVar114._12_4_ = uVar74;
      auVar114._16_4_ = uVar74;
      auVar114._20_4_ = uVar74;
      auVar114._24_4_ = uVar74;
      auVar114._28_4_ = uVar74;
      local_2988 = uVar59 + lVar60;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(local_29d0 + 0x40 + local_2988);
      auVar124 = vpmovzxbd_avx2(auVar2);
      auVar124 = vcvtdq2ps_avx(auVar124);
      auVar76 = vfmadd213ps_fma(auVar124,auVar114,auVar97);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = *(ulong *)(local_29d8 + 0x40 + local_2988);
      auVar124 = vpmovzxbd_avx2(auVar3);
      auVar124 = vcvtdq2ps_avx(auVar124);
      uVar74 = *(undefined4 *)(uVar59 + 0x74 + lVar60);
      auVar120._4_4_ = uVar74;
      auVar120._0_4_ = uVar74;
      auVar120._8_4_ = uVar74;
      auVar120._12_4_ = uVar74;
      auVar120._16_4_ = uVar74;
      auVar120._20_4_ = uVar74;
      auVar120._24_4_ = uVar74;
      auVar120._28_4_ = uVar74;
      uVar74 = *(undefined4 *)(uVar59 + 0x80 + lVar60);
      auVar135._4_4_ = uVar74;
      auVar135._0_4_ = uVar74;
      auVar135._8_4_ = uVar74;
      auVar135._12_4_ = uVar74;
      auVar135._16_4_ = uVar74;
      auVar135._20_4_ = uVar74;
      auVar135._24_4_ = uVar74;
      auVar135._28_4_ = uVar74;
      auVar85 = vfmadd213ps_fma(auVar124,auVar114,auVar97);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = *(ulong *)(local_29e0 + 0x40 + local_2988);
      auVar124 = vpmovzxbd_avx2(auVar4);
      auVar124 = vcvtdq2ps_avx(auVar124);
      auVar130 = vfmadd213ps_fma(auVar124,auVar135,auVar120);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(local_29e8 + 0x40 + local_2988);
      auVar124 = vpmovzxbd_avx2(auVar5);
      auVar124 = vcvtdq2ps_avx(auVar124);
      uVar74 = *(undefined4 *)(uVar59 + 0x78 + lVar60);
      auVar142._4_4_ = uVar74;
      auVar142._0_4_ = uVar74;
      auVar142._8_4_ = uVar74;
      auVar142._12_4_ = uVar74;
      auVar142._16_4_ = uVar74;
      auVar142._20_4_ = uVar74;
      auVar142._24_4_ = uVar74;
      auVar142._28_4_ = uVar74;
      uVar74 = *(undefined4 *)(uVar59 + 0x84 + lVar60);
      auVar147._4_4_ = uVar74;
      auVar147._0_4_ = uVar74;
      auVar147._8_4_ = uVar74;
      auVar147._12_4_ = uVar74;
      auVar147._16_4_ = uVar74;
      auVar147._20_4_ = uVar74;
      auVar147._24_4_ = uVar74;
      auVar147._28_4_ = uVar74;
      auVar113 = vfmadd213ps_fma(auVar124,auVar135,auVar120);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *(ulong *)(local_29f0 + 0x40 + local_2988);
      auVar124 = vpmovzxbd_avx2(auVar6);
      auVar124 = vcvtdq2ps_avx(auVar124);
      auVar131 = vfmadd213ps_fma(auVar124,auVar147,auVar142);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *(ulong *)(local_29f8 + 0x40 + local_2988);
      auVar124 = vpmovzxbd_avx2(auVar7);
      auVar124 = vcvtdq2ps_avx(auVar124);
      auVar95 = vfmadd213ps_fma(auVar124,auVar147,auVar142);
      auVar141._8_8_ = 0;
      auVar141._0_8_ = *(ulong *)(uVar59 + 0x40 + lVar60);
      auVar146._8_8_ = 0;
      auVar146._0_8_ = *(ulong *)(uVar59 + 0x48 + lVar60);
      auVar117 = vpminub_avx(auVar141,auVar146);
      auVar129 = vpcmpeqb_avx(auVar141,auVar117);
      auVar124 = vsubps_avx(ZEXT1632(auVar76),auVar145._0_32_);
      auVar134._4_4_ = fVar110 * auVar124._4_4_;
      auVar134._0_4_ = auVar118._0_4_ * auVar124._0_4_;
      auVar134._8_4_ = fVar94 * auVar124._8_4_;
      auVar134._12_4_ = fVar101 * auVar124._12_4_;
      auVar134._16_4_ = fVar103 * auVar124._16_4_;
      auVar134._20_4_ = fVar105 * auVar124._20_4_;
      auVar134._24_4_ = fVar107 * auVar124._24_4_;
      auVar134._28_4_ = auVar124._28_4_;
      auVar124 = vsubps_avx(ZEXT1632(auVar130),auVar140._0_32_);
      auVar27._4_4_ = auVar156._4_4_ * auVar124._4_4_;
      auVar27._0_4_ = auVar156._0_4_ * auVar124._0_4_;
      auVar27._8_4_ = auVar156._8_4_ * auVar124._8_4_;
      auVar27._12_4_ = auVar156._12_4_ * auVar124._12_4_;
      auVar27._16_4_ = auVar156._16_4_ * auVar124._16_4_;
      auVar27._20_4_ = auVar156._20_4_ * auVar124._20_4_;
      auVar27._24_4_ = auVar156._24_4_ * auVar124._24_4_;
      auVar27._28_4_ = auVar124._28_4_;
      auVar171 = ZEXT3264(local_2860);
      auVar124 = vmaxps_avx(auVar134,auVar27);
      auVar96 = vsubps_avx(ZEXT1632(auVar85),auVar145._0_32_);
      auVar28._4_4_ = auVar128._4_4_ * auVar96._4_4_;
      auVar28._0_4_ = auVar128._0_4_ * auVar96._0_4_;
      auVar28._8_4_ = auVar128._8_4_ * auVar96._8_4_;
      auVar28._12_4_ = auVar128._12_4_ * auVar96._12_4_;
      auVar28._16_4_ = auVar128._16_4_ * auVar96._16_4_;
      auVar28._20_4_ = auVar128._20_4_ * auVar96._20_4_;
      auVar28._24_4_ = auVar128._24_4_ * auVar96._24_4_;
      auVar28._28_4_ = auVar96._28_4_;
      auVar174 = ZEXT3264(local_2880);
      auVar96 = vsubps_avx(ZEXT1632(auVar113),auVar140._0_32_);
      auVar29._4_4_ = auVar176._4_4_ * auVar96._4_4_;
      auVar29._0_4_ = auVar176._0_4_ * auVar96._0_4_;
      auVar29._8_4_ = auVar176._8_4_ * auVar96._8_4_;
      auVar29._12_4_ = auVar176._12_4_ * auVar96._12_4_;
      auVar29._16_4_ = auVar176._16_4_ * auVar96._16_4_;
      auVar29._20_4_ = auVar176._20_4_ * auVar96._20_4_;
      auVar29._24_4_ = auVar176._24_4_ * auVar96._24_4_;
      auVar29._28_4_ = auVar96._28_4_;
      auVar13 = vminps_avx(auVar28,auVar29);
      auVar96 = vsubps_avx(ZEXT1632(auVar131),auVar168._0_32_);
      auVar30._4_4_ = auVar173._4_4_ * auVar96._4_4_;
      auVar30._0_4_ = auVar173._0_4_ * auVar96._0_4_;
      auVar30._8_4_ = auVar173._8_4_ * auVar96._8_4_;
      auVar30._12_4_ = auVar173._12_4_ * auVar96._12_4_;
      auVar30._16_4_ = auVar173._16_4_ * auVar96._16_4_;
      auVar30._20_4_ = auVar173._20_4_ * auVar96._20_4_;
      auVar30._24_4_ = auVar173._24_4_ * auVar96._24_4_;
      auVar30._28_4_ = auVar96._28_4_;
      auVar96 = vmaxps_avx(auVar30,local_2880);
      local_23c0 = vmaxps_avx(auVar124,auVar96);
      auVar124 = vsubps_avx(ZEXT1632(auVar95),auVar168._0_32_);
      auVar31._4_4_ = local_2860._4_4_ * auVar124._4_4_;
      auVar31._0_4_ = local_2860._0_4_ * auVar124._0_4_;
      auVar31._8_4_ = local_2860._8_4_ * auVar124._8_4_;
      auVar31._12_4_ = local_2860._12_4_ * auVar124._12_4_;
      auVar31._16_4_ = local_2860._16_4_ * auVar124._16_4_;
      auVar31._20_4_ = local_2860._20_4_ * auVar124._20_4_;
      auVar31._24_4_ = local_2860._24_4_ * auVar124._24_4_;
      auVar31._28_4_ = auVar124._28_4_;
      auVar124 = vminps_avx(auVar31,local_28a0);
      auVar124 = vminps_avx(auVar13,auVar124);
      auVar124 = vcmpps_avx(local_23c0,auVar124,2);
      auVar117 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
      auVar129 = vpmovzxbw_avx(auVar129);
      auVar117 = vpand_avx(auVar117,auVar129);
      auVar117 = vpshufb_avx(auVar117,_DAT_01fb8680);
      local_2978 = (ulong)(byte)(SUB161(auVar117 >> 7,0) & 1 | (SUB161(auVar117 >> 0xf,0) & 1) << 1
                                 | (SUB161(auVar117 >> 0x17,0) & 1) << 2 |
                                 (SUB161(auVar117 >> 0x1f,0) & 1) << 3 |
                                 (SUB161(auVar117 >> 0x27,0) & 1) << 4 |
                                 (SUB161(auVar117 >> 0x2f,0) & 1) << 5 |
                                 (SUB161(auVar117 >> 0x37,0) & 1) << 6 |
                                SUB161(auVar117 >> 0x3f,0) << 7);
      while (local_2978 != 0) {
        lVar60 = 0;
        for (uVar70 = local_2978; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
          lVar60 = lVar60 + 1;
        }
        local_2978 = local_2978 - 1 & local_2978;
        fVar110 = (ray->super_RayK<1>).tfar;
        if (*(float *)(local_23c0 + lVar60 * 4) <= fVar110) {
          local_27f0 = ZEXT416((uint)fVar110);
          uVar8 = *(ushort *)(local_2988 + lVar60 * 8);
          uVar9 = *(ushort *)(local_2988 + 2 + lVar60 * 8);
          uVar53 = *(uint *)(local_2988 + 0x88);
          local_2a10 = (ulong)uVar53;
          uVar54 = *(uint *)(local_2988 + 4 + lVar60 * 8);
          local_2980 = context->scene;
          pGVar10 = (local_2980->geometries).items[local_2a10].ptr;
          lVar60 = *(long *)&pGVar10->field_0x58;
          local_2a00 = (ulong)uVar54;
          lVar64 = pGVar10[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                   (ulong)uVar54;
          uVar65 = uVar8 & 0x7fff;
          local_2a08 = uVar9 & 0x7fff;
          uVar66 = *(uint *)(lVar60 + 4 + lVar64);
          uVar67 = (ulong)uVar66;
          uVar62 = (ulong)(uVar66 * local_2a08 + *(int *)(lVar60 + lVar64) + uVar65);
          lVar63 = *(long *)&pGVar10[1].time_range.upper;
          p_Var11 = pGVar10[1].intersectionFilterN;
          auVar117 = *(undefined1 (*) [16])(lVar63 + (uVar62 + 1) * (long)p_Var11);
          auVar129 = *(undefined1 (*) [16])(lVar63 + (uVar62 + uVar67) * (long)p_Var11);
          lVar72 = uVar62 + uVar67 + 1;
          auVar76 = *(undefined1 (*) [16])(lVar63 + lVar72 * (long)p_Var11);
          auVar85 = *(undefined1 (*) [16])
                     (lVar63 + (uVar62 + (-1 < (short)uVar8) + 1) * (long)p_Var11);
          lVar58 = (ulong)(-1 < (short)uVar8) + lVar72;
          uVar61 = 0;
          if (-1 < (short)uVar9) {
            uVar61 = uVar67;
          }
          auVar130 = *(undefined1 (*) [16])(lVar63 + lVar58 * (long)p_Var11);
          auVar113 = *(undefined1 (*) [16])(lVar63 + (uVar62 + uVar67 + uVar61) * (long)p_Var11);
          auVar118 = *(undefined1 (*) [16])(lVar63 + (lVar72 + uVar61) * (long)p_Var11);
          auVar151._16_16_ = *(undefined1 (*) [16])(lVar63 + (uVar61 + lVar58) * (long)p_Var11);
          auVar151._0_16_ = auVar76;
          auVar95 = vunpcklps_avx(auVar117,auVar130);
          auVar131 = vunpckhps_avx(auVar117,auVar130);
          auVar119 = vunpcklps_avx(auVar85,auVar76);
          auVar85 = vunpckhps_avx(auVar85,auVar76);
          auVar77 = vunpcklps_avx(auVar131,auVar85);
          auVar2 = vunpcklps_avx(auVar95,auVar119);
          auVar85 = vunpckhps_avx(auVar95,auVar119);
          auVar95 = vunpcklps_avx(auVar129,auVar118);
          auVar131 = vunpckhps_avx(auVar129,auVar118);
          auVar119 = vunpcklps_avx(auVar76,auVar113);
          auVar113 = vunpckhps_avx(auVar76,auVar113);
          auVar131 = vunpcklps_avx(auVar131,auVar113);
          auVar3 = vunpcklps_avx(auVar95,auVar119);
          auVar113 = vunpckhps_avx(auVar95,auVar119);
          auVar98._16_16_ = auVar118;
          auVar98._0_16_ = auVar129;
          auVar78._16_16_ = auVar130;
          auVar78._0_16_ = auVar117;
          auVar124 = vunpcklps_avx(auVar78,auVar98);
          auVar86._16_16_ = auVar76;
          auVar86._0_16_ = *(undefined1 (*) [16])(lVar63 + (long)p_Var11 * uVar62);
          auVar96 = vunpcklps_avx(auVar86,auVar151);
          auVar26 = vunpcklps_avx(auVar96,auVar124);
          auVar124 = vunpckhps_avx(auVar96,auVar124);
          auVar96 = vunpckhps_avx(auVar78,auVar98);
          auVar13 = vunpckhps_avx(auVar86,auVar151);
          auVar96 = vunpcklps_avx(auVar13,auVar96);
          auVar172._16_16_ = auVar2;
          auVar172._0_16_ = auVar2;
          auVar121._16_16_ = auVar85;
          auVar121._0_16_ = auVar85;
          auVar136._16_16_ = auVar77;
          auVar136._0_16_ = auVar77;
          auVar152._16_16_ = auVar3;
          auVar152._0_16_ = auVar3;
          auVar158._16_16_ = auVar113;
          auVar158._0_16_ = auVar113;
          uVar74 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar165._4_4_ = uVar74;
          auVar165._0_4_ = uVar74;
          auVar165._8_4_ = uVar74;
          auVar165._12_4_ = uVar74;
          auVar165._16_4_ = uVar74;
          auVar165._20_4_ = uVar74;
          auVar165._24_4_ = uVar74;
          auVar165._28_4_ = uVar74;
          uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar169._4_4_ = uVar74;
          auVar169._0_4_ = uVar74;
          auVar169._8_4_ = uVar74;
          auVar169._12_4_ = uVar74;
          auVar169._16_4_ = uVar74;
          auVar169._20_4_ = uVar74;
          auVar169._24_4_ = uVar74;
          auVar169._28_4_ = uVar74;
          auVar143._16_16_ = auVar131;
          auVar143._0_16_ = auVar131;
          uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar170._4_4_ = uVar74;
          auVar170._0_4_ = uVar74;
          auVar170._8_4_ = uVar74;
          auVar170._12_4_ = uVar74;
          auVar170._16_4_ = uVar74;
          auVar170._20_4_ = uVar74;
          auVar170._24_4_ = uVar74;
          auVar170._28_4_ = uVar74;
          local_23e0 = vsubps_avx(auVar26,auVar165);
          local_2400 = vsubps_avx(auVar124,auVar169);
          local_2420 = vsubps_avx(auVar96,auVar170);
          auVar124 = vsubps_avx(auVar172,auVar165);
          local_2840 = vsubps_avx(auVar121,auVar169);
          auVar96 = vsubps_avx(auVar136,auVar170);
          auVar13 = vsubps_avx(auVar152,auVar165);
          auVar24 = vsubps_avx(auVar158,auVar169);
          auVar116 = vsubps_avx(auVar143,auVar170);
          local_2440 = vsubps_avx(auVar13,local_23e0);
          local_2480 = vsubps_avx(auVar24,local_2400);
          local_2460 = vsubps_avx(auVar116,local_2420);
          auVar79._0_4_ = auVar13._0_4_ + local_23e0._0_4_;
          auVar79._4_4_ = auVar13._4_4_ + local_23e0._4_4_;
          auVar79._8_4_ = auVar13._8_4_ + local_23e0._8_4_;
          auVar79._12_4_ = auVar13._12_4_ + local_23e0._12_4_;
          auVar79._16_4_ = auVar13._16_4_ + local_23e0._16_4_;
          auVar79._20_4_ = auVar13._20_4_ + local_23e0._20_4_;
          auVar79._24_4_ = auVar13._24_4_ + local_23e0._24_4_;
          auVar79._28_4_ = auVar13._28_4_ + local_23e0._28_4_;
          auVar115._0_4_ = auVar24._0_4_ + local_2400._0_4_;
          auVar115._4_4_ = auVar24._4_4_ + local_2400._4_4_;
          auVar115._8_4_ = auVar24._8_4_ + local_2400._8_4_;
          auVar115._12_4_ = auVar24._12_4_ + local_2400._12_4_;
          auVar115._16_4_ = auVar24._16_4_ + local_2400._16_4_;
          auVar115._20_4_ = auVar24._20_4_ + local_2400._20_4_;
          auVar115._24_4_ = auVar24._24_4_ + local_2400._24_4_;
          auVar115._28_4_ = auVar24._28_4_ + local_2400._28_4_;
          fVar94 = local_2420._0_4_;
          auVar144._0_4_ = auVar116._0_4_ + fVar94;
          fVar101 = local_2420._4_4_;
          auVar144._4_4_ = auVar116._4_4_ + fVar101;
          fVar103 = local_2420._8_4_;
          auVar144._8_4_ = auVar116._8_4_ + fVar103;
          fVar105 = local_2420._12_4_;
          auVar144._12_4_ = auVar116._12_4_ + fVar105;
          fVar107 = local_2420._16_4_;
          auVar144._16_4_ = auVar116._16_4_ + fVar107;
          auVar118._0_4_ = local_2420._20_4_;
          auVar144._20_4_ = auVar116._20_4_ + auVar118._0_4_;
          fVar111 = local_2420._24_4_;
          auVar144._24_4_ = auVar116._24_4_ + fVar111;
          auVar144._28_4_ = auVar116._28_4_ + local_2420._28_4_;
          auVar32._4_4_ = local_2460._4_4_ * auVar115._4_4_;
          auVar32._0_4_ = local_2460._0_4_ * auVar115._0_4_;
          auVar32._8_4_ = local_2460._8_4_ * auVar115._8_4_;
          auVar32._12_4_ = local_2460._12_4_ * auVar115._12_4_;
          auVar32._16_4_ = local_2460._16_4_ * auVar115._16_4_;
          auVar32._20_4_ = local_2460._20_4_ * auVar115._20_4_;
          auVar32._24_4_ = local_2460._24_4_ * auVar115._24_4_;
          auVar32._28_4_ = auVar26._28_4_;
          auVar129 = vfmsub231ps_fma(auVar32,local_2480,auVar144);
          auVar33._4_4_ = local_2440._4_4_ * auVar144._4_4_;
          auVar33._0_4_ = local_2440._0_4_ * auVar144._0_4_;
          auVar33._8_4_ = local_2440._8_4_ * auVar144._8_4_;
          auVar33._12_4_ = local_2440._12_4_ * auVar144._12_4_;
          auVar33._16_4_ = local_2440._16_4_ * auVar144._16_4_;
          auVar33._20_4_ = local_2440._20_4_ * auVar144._20_4_;
          auVar33._24_4_ = local_2440._24_4_ * auVar144._24_4_;
          auVar33._28_4_ = auVar144._28_4_;
          auVar117 = vfmsub231ps_fma(auVar33,local_2460,auVar79);
          auVar34._4_4_ = local_2480._4_4_ * auVar79._4_4_;
          auVar34._0_4_ = local_2480._0_4_ * auVar79._0_4_;
          auVar34._8_4_ = local_2480._8_4_ * auVar79._8_4_;
          auVar34._12_4_ = local_2480._12_4_ * auVar79._12_4_;
          auVar34._16_4_ = local_2480._16_4_ * auVar79._16_4_;
          auVar34._20_4_ = local_2480._20_4_ * auVar79._20_4_;
          auVar34._24_4_ = local_2480._24_4_ * auVar79._24_4_;
          auVar34._28_4_ = auVar79._28_4_;
          auVar76 = vfmsub231ps_fma(auVar34,local_2440,auVar115);
          uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
          local_28c0._4_4_ = uVar74;
          local_28c0._0_4_ = uVar74;
          local_28c0._8_4_ = uVar74;
          local_28c0._12_4_ = uVar74;
          local_28c0._16_4_ = uVar74;
          local_28c0._20_4_ = uVar74;
          local_28c0._24_4_ = uVar74;
          local_28c0._28_4_ = uVar74;
          local_2940._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar35._4_4_ = (float)local_2940._4_4_ * auVar76._4_4_;
          auVar35._0_4_ = (float)local_2940._4_4_ * auVar76._0_4_;
          auVar35._8_4_ = (float)local_2940._4_4_ * auVar76._8_4_;
          auVar35._12_4_ = (float)local_2940._4_4_ * auVar76._12_4_;
          auVar35._16_4_ = (float)local_2940._4_4_ * 0.0;
          auVar35._20_4_ = (float)local_2940._4_4_ * 0.0;
          auVar35._24_4_ = (float)local_2940._4_4_ * 0.0;
          auVar35._28_4_ = auVar115._28_4_;
          auVar117 = vfmadd231ps_fma(auVar35,local_28c0,ZEXT1632(auVar117));
          uVar74 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
          local_2920._4_4_ = uVar74;
          local_2920._0_4_ = uVar74;
          local_2920._8_4_ = uVar74;
          local_2920._12_4_ = uVar74;
          local_2920._16_4_ = uVar74;
          local_2920._20_4_ = uVar74;
          local_2920._24_4_ = uVar74;
          local_2920._28_4_ = uVar74;
          auVar117 = vfmadd231ps_fma(ZEXT1632(auVar117),local_2920,ZEXT1632(auVar129));
          local_24a0 = vsubps_avx(local_2400,local_2840);
          local_24c0 = vsubps_avx(local_2420,auVar96);
          auVar175._0_4_ = local_2400._0_4_ + local_2840._0_4_;
          auVar175._4_4_ = local_2400._4_4_ + local_2840._4_4_;
          auVar175._8_4_ = local_2400._8_4_ + local_2840._8_4_;
          auVar175._12_4_ = local_2400._12_4_ + local_2840._12_4_;
          auVar175._16_4_ = local_2400._16_4_ + local_2840._16_4_;
          auVar175._20_4_ = local_2400._20_4_ + local_2840._20_4_;
          auVar175._24_4_ = local_2400._24_4_ + local_2840._24_4_;
          auVar175._28_4_ = local_2400._28_4_ + local_2840._28_4_;
          auVar148._0_4_ = auVar96._0_4_ + fVar94;
          auVar148._4_4_ = auVar96._4_4_ + fVar101;
          auVar148._8_4_ = auVar96._8_4_ + fVar103;
          auVar148._12_4_ = auVar96._12_4_ + fVar105;
          auVar148._16_4_ = auVar96._16_4_ + fVar107;
          auVar148._20_4_ = auVar96._20_4_ + auVar118._0_4_;
          auVar148._24_4_ = auVar96._24_4_ + fVar111;
          fVar84 = auVar96._28_4_;
          auVar148._28_4_ = fVar84 + local_2420._28_4_;
          fVar75 = local_24c0._0_4_;
          fVar83 = local_24c0._4_4_;
          auVar36._4_4_ = auVar175._4_4_ * fVar83;
          auVar36._0_4_ = auVar175._0_4_ * fVar75;
          fVar102 = local_24c0._8_4_;
          auVar36._8_4_ = auVar175._8_4_ * fVar102;
          fVar108 = local_24c0._12_4_;
          auVar36._12_4_ = auVar175._12_4_ * fVar108;
          fVar15 = local_24c0._16_4_;
          auVar36._16_4_ = auVar175._16_4_ * fVar15;
          fVar18 = local_24c0._20_4_;
          auVar36._20_4_ = auVar175._20_4_ * fVar18;
          fVar21 = local_24c0._24_4_;
          auVar36._24_4_ = auVar175._24_4_ * fVar21;
          auVar36._28_4_ = local_2440._28_4_;
          auVar76 = vfmsub231ps_fma(auVar36,local_24a0,auVar148);
          auVar26 = vsubps_avx(local_23e0,auVar124);
          fVar81 = auVar26._0_4_;
          fVar93 = auVar26._4_4_;
          auVar37._4_4_ = auVar148._4_4_ * fVar93;
          auVar37._0_4_ = auVar148._0_4_ * fVar81;
          fVar104 = auVar26._8_4_;
          auVar37._8_4_ = auVar148._8_4_ * fVar104;
          fVar109 = auVar26._12_4_;
          auVar37._12_4_ = auVar148._12_4_ * fVar109;
          fVar16 = auVar26._16_4_;
          auVar37._16_4_ = auVar148._16_4_ * fVar16;
          fVar19 = auVar26._20_4_;
          auVar37._20_4_ = auVar148._20_4_ * fVar19;
          fVar22 = auVar26._24_4_;
          auVar37._24_4_ = auVar148._24_4_ * fVar22;
          auVar37._28_4_ = local_2460._28_4_;
          auVar149._0_4_ = auVar124._0_4_ + local_23e0._0_4_;
          auVar149._4_4_ = auVar124._4_4_ + local_23e0._4_4_;
          auVar149._8_4_ = auVar124._8_4_ + local_23e0._8_4_;
          auVar149._12_4_ = auVar124._12_4_ + local_23e0._12_4_;
          auVar149._16_4_ = auVar124._16_4_ + local_23e0._16_4_;
          auVar149._20_4_ = auVar124._20_4_ + local_23e0._20_4_;
          auVar149._24_4_ = auVar124._24_4_ + local_23e0._24_4_;
          auVar149._28_4_ = auVar124._28_4_ + local_23e0._28_4_;
          auVar129 = vfmsub231ps_fma(auVar37,local_24c0,auVar149);
          fVar82 = local_24a0._0_4_;
          fVar100 = local_24a0._4_4_;
          auVar38._4_4_ = auVar149._4_4_ * fVar100;
          auVar38._0_4_ = auVar149._0_4_ * fVar82;
          fVar106 = local_24a0._8_4_;
          auVar38._8_4_ = auVar149._8_4_ * fVar106;
          fVar14 = local_24a0._12_4_;
          auVar38._12_4_ = auVar149._12_4_ * fVar14;
          fVar17 = local_24a0._16_4_;
          auVar38._16_4_ = auVar149._16_4_ * fVar17;
          fVar20 = local_24a0._20_4_;
          auVar38._20_4_ = auVar149._20_4_ * fVar20;
          fVar23 = local_24a0._24_4_;
          auVar38._24_4_ = auVar149._24_4_ * fVar23;
          auVar38._28_4_ = auVar149._28_4_;
          auVar85 = vfmsub231ps_fma(auVar38,auVar26,auVar175);
          auVar150._0_4_ = (float)local_2940._4_4_ * auVar85._0_4_;
          auVar150._4_4_ = (float)local_2940._4_4_ * auVar85._4_4_;
          auVar150._8_4_ = (float)local_2940._4_4_ * auVar85._8_4_;
          auVar150._12_4_ = (float)local_2940._4_4_ * auVar85._12_4_;
          auVar150._16_4_ = (float)local_2940._4_4_ * 0.0;
          auVar150._20_4_ = (float)local_2940._4_4_ * 0.0;
          auVar150._24_4_ = (float)local_2940._4_4_ * 0.0;
          auVar150._28_4_ = 0;
          auVar129 = vfmadd231ps_fma(auVar150,local_28c0,ZEXT1632(auVar129));
          auVar129 = vfmadd231ps_fma(ZEXT1632(auVar129),local_2920,ZEXT1632(auVar76));
          auVar25 = vsubps_avx(auVar124,auVar13);
          auVar137._0_4_ = auVar124._0_4_ + auVar13._0_4_;
          auVar137._4_4_ = auVar124._4_4_ + auVar13._4_4_;
          auVar137._8_4_ = auVar124._8_4_ + auVar13._8_4_;
          auVar137._12_4_ = auVar124._12_4_ + auVar13._12_4_;
          auVar137._16_4_ = auVar124._16_4_ + auVar13._16_4_;
          auVar137._20_4_ = auVar124._20_4_ + auVar13._20_4_;
          auVar137._24_4_ = auVar124._24_4_ + auVar13._24_4_;
          auVar137._28_4_ = auVar124._28_4_ + auVar13._28_4_;
          auVar125 = vsubps_avx(local_2840,auVar24);
          auVar122._0_4_ = auVar24._0_4_ + local_2840._0_4_;
          auVar122._4_4_ = auVar24._4_4_ + local_2840._4_4_;
          auVar122._8_4_ = auVar24._8_4_ + local_2840._8_4_;
          auVar122._12_4_ = auVar24._12_4_ + local_2840._12_4_;
          auVar122._16_4_ = auVar24._16_4_ + local_2840._16_4_;
          auVar122._20_4_ = auVar24._20_4_ + local_2840._20_4_;
          auVar122._24_4_ = auVar24._24_4_ + local_2840._24_4_;
          auVar122._28_4_ = auVar24._28_4_ + local_2840._28_4_;
          auVar24 = vsubps_avx(auVar96,auVar116);
          auVar87._0_4_ = auVar96._0_4_ + auVar116._0_4_;
          auVar87._4_4_ = auVar96._4_4_ + auVar116._4_4_;
          auVar87._8_4_ = auVar96._8_4_ + auVar116._8_4_;
          auVar87._12_4_ = auVar96._12_4_ + auVar116._12_4_;
          auVar87._16_4_ = auVar96._16_4_ + auVar116._16_4_;
          auVar87._20_4_ = auVar96._20_4_ + auVar116._20_4_;
          auVar87._24_4_ = auVar96._24_4_ + auVar116._24_4_;
          auVar87._28_4_ = fVar84 + auVar116._28_4_;
          auVar39._4_4_ = auVar24._4_4_ * auVar122._4_4_;
          auVar39._0_4_ = auVar24._0_4_ * auVar122._0_4_;
          auVar39._8_4_ = auVar24._8_4_ * auVar122._8_4_;
          auVar39._12_4_ = auVar24._12_4_ * auVar122._12_4_;
          auVar39._16_4_ = auVar24._16_4_ * auVar122._16_4_;
          auVar39._20_4_ = auVar24._20_4_ * auVar122._20_4_;
          auVar39._24_4_ = auVar24._24_4_ * auVar122._24_4_;
          auVar39._28_4_ = fVar84;
          auVar85 = vfmsub231ps_fma(auVar39,auVar125,auVar87);
          auVar40._4_4_ = auVar87._4_4_ * auVar25._4_4_;
          auVar40._0_4_ = auVar87._0_4_ * auVar25._0_4_;
          auVar40._8_4_ = auVar87._8_4_ * auVar25._8_4_;
          auVar40._12_4_ = auVar87._12_4_ * auVar25._12_4_;
          auVar40._16_4_ = auVar87._16_4_ * auVar25._16_4_;
          auVar40._20_4_ = auVar87._20_4_ * auVar25._20_4_;
          auVar40._24_4_ = auVar87._24_4_ * auVar25._24_4_;
          auVar40._28_4_ = auVar87._28_4_;
          auVar76 = vfmsub231ps_fma(auVar40,auVar24,auVar137);
          auVar41._4_4_ = auVar125._4_4_ * auVar137._4_4_;
          auVar41._0_4_ = auVar125._0_4_ * auVar137._0_4_;
          auVar41._8_4_ = auVar125._8_4_ * auVar137._8_4_;
          auVar41._12_4_ = auVar125._12_4_ * auVar137._12_4_;
          auVar41._16_4_ = auVar125._16_4_ * auVar137._16_4_;
          auVar41._20_4_ = auVar125._20_4_ * auVar137._20_4_;
          auVar41._24_4_ = auVar125._24_4_ * auVar137._24_4_;
          auVar41._28_4_ = auVar137._28_4_;
          auVar130 = vfmsub231ps_fma(auVar41,auVar25,auVar122);
          local_2940._0_4_ = local_2940._4_4_;
          fStack_2938 = (float)local_2940._4_4_;
          fStack_2934 = (float)local_2940._4_4_;
          fStack_2930 = (float)local_2940._4_4_;
          fStack_292c = (float)local_2940._4_4_;
          fStack_2928 = (float)local_2940._4_4_;
          fStack_2924 = (float)local_2940._4_4_;
          auVar138._0_4_ = (float)local_2940._4_4_ * auVar130._0_4_;
          auVar138._4_4_ = (float)local_2940._4_4_ * auVar130._4_4_;
          auVar138._8_4_ = (float)local_2940._4_4_ * auVar130._8_4_;
          auVar138._12_4_ = (float)local_2940._4_4_ * auVar130._12_4_;
          auVar138._16_4_ = (float)local_2940._4_4_ * 0.0;
          auVar138._20_4_ = (float)local_2940._4_4_ * 0.0;
          auVar138._24_4_ = (float)local_2940._4_4_ * 0.0;
          auVar138._28_4_ = 0;
          auVar76 = vfmadd231ps_fma(auVar138,local_28c0,ZEXT1632(auVar76));
          auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_2920,ZEXT1632(auVar85));
          fVar84 = auVar76._0_4_ + auVar117._0_4_ + auVar129._0_4_;
          fVar90 = auVar76._4_4_ + auVar117._4_4_ + auVar129._4_4_;
          fVar91 = auVar76._8_4_ + auVar117._8_4_ + auVar129._8_4_;
          fVar92 = auVar76._12_4_ + auVar117._12_4_ + auVar129._12_4_;
          local_2840 = ZEXT1632(CONCAT412(fVar92,CONCAT48(fVar91,CONCAT44(fVar90,fVar84))));
          auVar123._8_4_ = 0x7fffffff;
          auVar123._0_8_ = 0x7fffffff7fffffff;
          auVar123._12_4_ = 0x7fffffff;
          auVar123._16_4_ = 0x7fffffff;
          auVar123._20_4_ = 0x7fffffff;
          auVar123._24_4_ = 0x7fffffff;
          auVar123._28_4_ = 0x7fffffff;
          auVar116 = ZEXT1632(auVar117);
          auVar124 = vminps_avx(auVar116,ZEXT1632(auVar129));
          auVar124 = vminps_avx(auVar124,ZEXT1632(auVar76));
          local_2520 = vandps_avx(local_2840,auVar123);
          local_2500._8_4_ = 0x80000000;
          local_2500._0_8_ = 0x8000000080000000;
          local_2500._12_4_ = 0x80000000;
          local_2500._16_4_ = 0x80000000;
          local_2500._20_4_ = 0x80000000;
          local_2500._24_4_ = 0x80000000;
          local_2500._28_4_ = 0x80000000;
          fVar157 = local_2520._0_4_ * 1.1920929e-07;
          fVar159 = local_2520._4_4_ * 1.1920929e-07;
          auVar42._4_4_ = fVar159;
          auVar42._0_4_ = fVar157;
          fVar160 = local_2520._8_4_ * 1.1920929e-07;
          auVar42._8_4_ = fVar160;
          fVar161 = local_2520._12_4_ * 1.1920929e-07;
          auVar42._12_4_ = fVar161;
          fVar162 = local_2520._16_4_ * 1.1920929e-07;
          auVar42._16_4_ = fVar162;
          fVar163 = local_2520._20_4_ * 1.1920929e-07;
          auVar42._20_4_ = fVar163;
          fVar164 = local_2520._24_4_ * 1.1920929e-07;
          auVar42._24_4_ = fVar164;
          auVar42._28_4_ = 0x34000000;
          auVar166._0_8_ = CONCAT44(fVar159,fVar157) ^ 0x8000000080000000;
          auVar166._8_4_ = -fVar160;
          auVar166._12_4_ = -fVar161;
          auVar166._16_4_ = -fVar162;
          auVar166._20_4_ = -fVar163;
          auVar166._24_4_ = -fVar164;
          auVar166._28_4_ = 0xb4000000;
          auVar124 = vcmpps_avx(auVar124,auVar166,5);
          auVar134 = ZEXT1632(auVar129);
          auVar13 = vmaxps_avx(auVar116,auVar134);
          auVar96 = vmaxps_avx(auVar13,ZEXT1632(auVar76));
          auVar96 = vcmpps_avx(auVar96,auVar42,2);
          local_24e0 = vorps_avx(auVar124,auVar96);
          auVar96 = local_27e0 & local_24e0;
          if ((((((((auVar96 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar96 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar96 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar96 >> 0x7f,0) != '\0') ||
                (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar96 >> 0xbf,0) != '\0') ||
              (auVar96 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar96[0x1f] < '\0') {
            auVar43._4_4_ = local_2460._4_4_ * fVar100;
            auVar43._0_4_ = local_2460._0_4_ * fVar82;
            auVar43._8_4_ = local_2460._8_4_ * fVar106;
            auVar43._12_4_ = local_2460._12_4_ * fVar14;
            auVar43._16_4_ = local_2460._16_4_ * fVar17;
            auVar43._20_4_ = local_2460._20_4_ * fVar20;
            auVar43._24_4_ = local_2460._24_4_ * fVar23;
            auVar43._28_4_ = local_24e0._28_4_;
            auVar44._4_4_ = local_2480._4_4_ * fVar93;
            auVar44._0_4_ = local_2480._0_4_ * fVar81;
            auVar44._8_4_ = local_2480._8_4_ * fVar104;
            auVar44._12_4_ = local_2480._12_4_ * fVar109;
            auVar44._16_4_ = local_2480._16_4_ * fVar16;
            auVar44._20_4_ = local_2480._20_4_ * fVar19;
            auVar44._24_4_ = local_2480._24_4_ * fVar22;
            auVar44._28_4_ = auVar124._28_4_;
            auVar117 = vfmsub213ps_fma(local_2480,local_24c0,auVar43);
            auVar45._4_4_ = auVar125._4_4_ * fVar83;
            auVar45._0_4_ = auVar125._0_4_ * fVar75;
            auVar45._8_4_ = auVar125._8_4_ * fVar102;
            auVar45._12_4_ = auVar125._12_4_ * fVar108;
            auVar45._16_4_ = auVar125._16_4_ * fVar15;
            auVar45._20_4_ = auVar125._20_4_ * fVar18;
            auVar45._24_4_ = auVar125._24_4_ * fVar21;
            auVar45._28_4_ = 0x34000000;
            auVar46._4_4_ = fVar93 * auVar24._4_4_;
            auVar46._0_4_ = fVar81 * auVar24._0_4_;
            auVar46._8_4_ = fVar104 * auVar24._8_4_;
            auVar46._12_4_ = fVar109 * auVar24._12_4_;
            auVar46._16_4_ = fVar16 * auVar24._16_4_;
            auVar46._20_4_ = fVar19 * auVar24._20_4_;
            auVar46._24_4_ = fVar22 * auVar24._24_4_;
            auVar46._28_4_ = auVar13._28_4_;
            auVar129 = vfmsub213ps_fma(auVar24,local_24a0,auVar45);
            auVar124 = vandps_avx(auVar43,auVar123);
            auVar96 = vandps_avx(auVar45,auVar123);
            auVar124 = vcmpps_avx(auVar124,auVar96,1);
            auVar13 = vblendvps_avx(ZEXT1632(auVar129),ZEXT1632(auVar117),auVar124);
            auVar47._4_4_ = fVar100 * auVar25._4_4_;
            auVar47._0_4_ = fVar82 * auVar25._0_4_;
            auVar47._8_4_ = fVar106 * auVar25._8_4_;
            auVar47._12_4_ = fVar14 * auVar25._12_4_;
            auVar47._16_4_ = fVar17 * auVar25._16_4_;
            auVar47._20_4_ = fVar20 * auVar25._20_4_;
            auVar47._24_4_ = fVar23 * auVar25._24_4_;
            auVar47._28_4_ = auVar96._28_4_;
            auVar117 = vfmsub213ps_fma(auVar25,local_24c0,auVar46);
            auVar48._4_4_ = local_2440._4_4_ * fVar83;
            auVar48._0_4_ = local_2440._0_4_ * fVar75;
            auVar48._8_4_ = local_2440._8_4_ * fVar102;
            auVar48._12_4_ = local_2440._12_4_ * fVar108;
            auVar48._16_4_ = local_2440._16_4_ * fVar15;
            auVar48._20_4_ = local_2440._20_4_ * fVar18;
            auVar48._24_4_ = local_2440._24_4_ * fVar21;
            auVar48._28_4_ = local_24c0._28_4_;
            auVar129 = vfmsub213ps_fma(local_2460,auVar26,auVar48);
            auVar124 = vandps_avx(auVar48,auVar123);
            auVar96 = vandps_avx(auVar46,auVar123);
            auVar124 = vcmpps_avx(auVar124,auVar96,1);
            auVar24 = vblendvps_avx(ZEXT1632(auVar117),ZEXT1632(auVar129),auVar124);
            auVar117 = vfmsub213ps_fma(local_2440,local_24a0,auVar44);
            auVar129 = vfmsub213ps_fma(auVar125,auVar26,auVar47);
            auVar124 = vandps_avx(auVar44,auVar123);
            auVar96 = vandps_avx(auVar47,auVar123);
            auVar124 = vcmpps_avx(auVar124,auVar96,1);
            auVar25 = vblendvps_avx(ZEXT1632(auVar129),ZEXT1632(auVar117),auVar124);
            fVar93 = auVar25._0_4_;
            fVar100 = auVar25._4_4_;
            auVar49._4_4_ = fVar100 * (float)local_2940._4_4_;
            auVar49._0_4_ = fVar93 * (float)local_2940._4_4_;
            fVar102 = auVar25._8_4_;
            auVar49._8_4_ = fVar102 * (float)local_2940._4_4_;
            fVar104 = auVar25._12_4_;
            auVar49._12_4_ = fVar104 * (float)local_2940._4_4_;
            fVar106 = auVar25._16_4_;
            auVar49._16_4_ = fVar106 * (float)local_2940._4_4_;
            fVar108 = auVar25._20_4_;
            auVar49._20_4_ = fVar108 * (float)local_2940._4_4_;
            fVar109 = auVar25._24_4_;
            auVar49._24_4_ = fVar109 * (float)local_2940._4_4_;
            auVar49._28_4_ = auVar124._28_4_;
            auVar117 = vfmadd213ps_fma(local_28c0,auVar24,auVar49);
            auVar117 = vfmadd213ps_fma(local_2920,auVar13,ZEXT1632(auVar117));
            fVar75 = auVar117._0_4_ + auVar117._0_4_;
            fVar81 = auVar117._4_4_ + auVar117._4_4_;
            fVar82 = auVar117._8_4_ + auVar117._8_4_;
            fVar83 = auVar117._12_4_ + auVar117._12_4_;
            auVar125 = ZEXT1632(CONCAT412(fVar83,CONCAT48(fVar82,CONCAT44(fVar81,fVar75))));
            auVar50._4_4_ = fVar100 * fVar101;
            auVar50._0_4_ = fVar93 * fVar94;
            auVar50._8_4_ = fVar102 * fVar103;
            auVar50._12_4_ = fVar104 * fVar105;
            auVar50._16_4_ = fVar106 * fVar107;
            auVar50._20_4_ = fVar108 * auVar118._0_4_;
            auVar50._24_4_ = fVar109 * fVar111;
            auVar50._28_4_ = auVar96._28_4_;
            auVar117 = vfmadd213ps_fma(local_2400,auVar24,auVar50);
            auVar129 = vfmadd213ps_fma(local_23e0,auVar13,ZEXT1632(auVar117));
            auVar124 = vrcpps_avx(auVar125);
            auVar167._8_4_ = 0x3f800000;
            auVar167._0_8_ = 0x3f8000003f800000;
            auVar167._12_4_ = 0x3f800000;
            auVar167._16_4_ = 0x3f800000;
            auVar167._20_4_ = 0x3f800000;
            auVar167._24_4_ = 0x3f800000;
            auVar167._28_4_ = 0x3f800000;
            auVar117 = vfnmadd213ps_fma(auVar124,auVar125,auVar167);
            auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar124,auVar124);
            uVar74 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
            auVar153._4_4_ = uVar74;
            auVar153._0_4_ = uVar74;
            auVar153._8_4_ = uVar74;
            auVar153._12_4_ = uVar74;
            auVar153._16_4_ = uVar74;
            auVar153._20_4_ = uVar74;
            auVar153._24_4_ = uVar74;
            auVar153._28_4_ = uVar74;
            local_26e0 = ZEXT1632(CONCAT412(auVar117._12_4_ * (auVar129._12_4_ + auVar129._12_4_),
                                            CONCAT48(auVar117._8_4_ *
                                                     (auVar129._8_4_ + auVar129._8_4_),
                                                     CONCAT44(auVar117._4_4_ *
                                                              (auVar129._4_4_ + auVar129._4_4_),
                                                              auVar117._0_4_ *
                                                              (auVar129._0_4_ + auVar129._0_4_)))));
            auVar128 = ZEXT3264(local_26e0);
            auVar124 = vcmpps_avx(auVar153,local_26e0,2);
            auVar154._4_4_ = fVar110;
            auVar154._0_4_ = fVar110;
            auVar154._8_4_ = fVar110;
            auVar154._12_4_ = fVar110;
            auVar154._16_4_ = fVar110;
            auVar154._20_4_ = fVar110;
            auVar154._24_4_ = fVar110;
            auVar154._28_4_ = fVar110;
            auVar96 = vcmpps_avx(local_26e0,auVar154,2);
            auVar124 = vandps_avx(auVar96,auVar124);
            auVar155._0_8_ = CONCAT44(fVar81,fVar75) ^ 0x8000000080000000;
            auVar155._8_4_ = -fVar82;
            auVar155._12_4_ = -fVar83;
            auVar155._16_4_ = 0x80000000;
            auVar155._20_4_ = 0x80000000;
            auVar155._24_4_ = 0x80000000;
            auVar155._28_4_ = 0x80000000;
            auVar96 = vcmpps_avx(auVar155,auVar125,4);
            auVar124 = vandps_avx(auVar96,auVar124);
            auVar96 = vandps_avx(local_24e0,local_27e0);
            auVar124 = vpslld_avx2(auVar124,0x1f);
            auVar125 = vpsrad_avx2(auVar124,0x1f);
            auVar124 = auVar96 & auVar125;
            if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar124 >> 0x7f,0) != '\0') ||
                  (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0xbf,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar124[0x1f] < '\0') {
              auVar124 = vandps_avx(auVar125,auVar96);
              uVar66 = vextractps_avx(SUB3216(*(undefined1 (*) [32])
                                               ((long)&(ray->super_RayK<1>).org.field_0 + 0xc),0x10)
                                      ,2);
              local_2780 = local_2840;
              local_2760 = &local_2a21;
              local_2740 = auVar124;
              auVar96 = vsubps_avx(local_2840,auVar134);
              auVar96 = vblendvps_avx(auVar116,auVar96,local_25a0);
              auVar116 = vsubps_avx(local_2840,auVar116);
              local_27a0 = vblendvps_avx(auVar134,auVar116,local_25a0);
              local_26c0[0] = (float)local_25c0._0_4_ * auVar13._0_4_;
              local_26c0[1] = (float)local_25c0._4_4_ * auVar13._4_4_;
              local_26c0[2] = fStack_25b8 * auVar13._8_4_;
              local_26c0[3] = fStack_25b4 * auVar13._12_4_;
              fStack_26b0 = fStack_25b0 * auVar13._16_4_;
              fStack_26ac = fStack_25ac * auVar13._20_4_;
              fStack_26a8 = fStack_25a8 * auVar13._24_4_;
              uStack_26a4 = auVar13._28_4_;
              local_26a0[0] = (float)local_25c0._0_4_ * auVar24._0_4_;
              local_26a0[1] = (float)local_25c0._4_4_ * auVar24._4_4_;
              local_26a0[2] = fStack_25b8 * auVar24._8_4_;
              local_26a0[3] = fStack_25b4 * auVar24._12_4_;
              fStack_2690 = fStack_25b0 * auVar24._16_4_;
              fStack_268c = fStack_25ac * auVar24._20_4_;
              fStack_2688 = fStack_25a8 * auVar24._24_4_;
              uStack_2684 = auVar13._28_4_;
              local_2680[0] = (float)local_25c0._0_4_ * fVar93;
              local_2680[1] = (float)local_25c0._4_4_ * fVar100;
              local_2680[2] = fStack_25b8 * fVar102;
              local_2680[3] = fStack_25b4 * fVar104;
              fStack_2670 = fStack_25b0 * fVar106;
              fStack_266c = fStack_25ac * fVar108;
              fStack_2668 = fStack_25a8 * fVar109;
              uStack_2664 = auVar25._28_4_;
              auVar99._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
              auVar99._8_4_ = uVar65;
              auVar99._12_4_ = uVar65;
              auVar99._16_4_ = uVar65;
              auVar99._20_4_ = uVar65;
              auVar99._24_4_ = uVar65;
              auVar99._28_4_ = uVar65;
              auVar132._0_4_ = (float)(int)(*(ushort *)(lVar60 + 8 + lVar64) - 1);
              auVar132._4_12_ = auVar26._4_12_;
              auVar13 = vpaddd_avx2(auVar99,_DAT_01fb7740);
              auVar117 = vrcpss_avx(auVar132,auVar132);
              auVar129 = vfnmadd213ss_fma(auVar117,auVar132,ZEXT416(0x40000000));
              fVar110 = auVar117._0_4_ * auVar129._0_4_;
              auVar13 = vcvtdq2ps_avx(auVar13);
              fVar111 = auVar13._28_4_ + auVar96._28_4_;
              fVar94 = (fVar84 * auVar13._0_4_ + auVar96._0_4_) * fVar110;
              fVar101 = (fVar90 * auVar13._4_4_ + auVar96._4_4_) * fVar110;
              local_27c0._4_4_ = fVar101;
              local_27c0._0_4_ = fVar94;
              fVar103 = (fVar91 * auVar13._8_4_ + auVar96._8_4_) * fVar110;
              local_27c0._8_4_ = fVar103;
              fVar105 = (fVar92 * auVar13._12_4_ + auVar96._12_4_) * fVar110;
              local_27c0._12_4_ = fVar105;
              fVar107 = (auVar13._16_4_ * 0.0 + auVar96._16_4_) * fVar110;
              local_27c0._16_4_ = fVar107;
              auVar118._0_4_ = (auVar13._20_4_ * 0.0 + auVar96._20_4_) * fVar110;
              local_27c0._20_4_ = auVar118._0_4_;
              fVar110 = (auVar13._24_4_ * 0.0 + auVar96._24_4_) * fVar110;
              local_27c0._24_4_ = fVar110;
              local_27c0._28_4_ = fVar111;
              pGVar10 = (local_2980->geometries).items[local_2a10].ptr;
              if ((pGVar10->mask & uVar66) != 0) {
                auVar126._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                auVar126._8_4_ = local_2a08;
                auVar126._12_4_ = local_2a08;
                auVar126._16_4_ = local_2a08;
                auVar126._20_4_ = local_2a08;
                auVar126._24_4_ = local_2a08;
                auVar126._28_4_ = local_2a08;
                auVar96 = vpaddd_avx2(auVar126,_DAT_01fb7760);
                auVar13 = vcvtdq2ps_avx(auVar96);
                auVar133._0_4_ = (float)(int)(*(ushort *)(lVar60 + 10 + lVar64) - 1);
                auVar133._4_12_ = auVar26._4_12_;
                auVar117 = vrcpss_avx(auVar133,auVar133);
                auVar129 = vfnmadd213ss_fma(auVar117,auVar133,ZEXT416(0x40000000));
                fVar75 = auVar117._0_4_ * auVar129._0_4_;
                local_2820 = auVar124;
                auVar96 = vrcpps_avx(local_2840);
                auVar139._8_4_ = 0x3f800000;
                auVar139._0_8_ = 0x3f8000003f800000;
                auVar139._12_4_ = 0x3f800000;
                auVar139._16_4_ = 0x3f800000;
                auVar139._20_4_ = 0x3f800000;
                auVar139._24_4_ = 0x3f800000;
                auVar139._28_4_ = 0x3f800000;
                auVar117 = vfnmadd213ps_fma(local_2840,auVar96,auVar139);
                auVar117 = vfmadd132ps_fma(ZEXT1632(auVar117),auVar96,auVar96);
                auVar127._8_4_ = 0x219392ef;
                auVar127._0_8_ = 0x219392ef219392ef;
                auVar127._12_4_ = 0x219392ef;
                auVar127._16_4_ = 0x219392ef;
                auVar127._20_4_ = 0x219392ef;
                auVar127._24_4_ = 0x219392ef;
                auVar127._28_4_ = 0x219392ef;
                auVar96 = vcmpps_avx(local_2520,auVar127,5);
                auVar96 = vandps_avx(auVar96,ZEXT1632(auVar117));
                auVar51._4_4_ = fVar101 * auVar96._4_4_;
                auVar51._0_4_ = fVar94 * auVar96._0_4_;
                auVar51._8_4_ = fVar103 * auVar96._8_4_;
                auVar51._12_4_ = fVar105 * auVar96._12_4_;
                auVar51._16_4_ = fVar107 * auVar96._16_4_;
                auVar51._20_4_ = auVar118._0_4_ * auVar96._20_4_;
                auVar51._24_4_ = fVar110 * auVar96._24_4_;
                auVar51._28_4_ = fVar111;
                local_2720 = vminps_avx(auVar51,auVar139);
                auVar52._4_4_ = (fVar90 * auVar13._4_4_ + local_27a0._4_4_) * fVar75 * auVar96._4_4_
                ;
                auVar52._0_4_ = (fVar84 * auVar13._0_4_ + local_27a0._0_4_) * fVar75 * auVar96._0_4_
                ;
                auVar52._8_4_ = (fVar91 * auVar13._8_4_ + local_27a0._8_4_) * fVar75 * auVar96._8_4_
                ;
                auVar52._12_4_ =
                     (fVar92 * auVar13._12_4_ + local_27a0._12_4_) * fVar75 * auVar96._12_4_;
                auVar52._16_4_ =
                     (auVar13._16_4_ * 0.0 + local_27a0._16_4_) * fVar75 * auVar96._16_4_;
                auVar52._20_4_ =
                     (auVar13._20_4_ * 0.0 + local_27a0._20_4_) * fVar75 * auVar96._20_4_;
                auVar52._24_4_ =
                     (auVar13._24_4_ * 0.0 + local_27a0._24_4_) * fVar75 * auVar96._24_4_;
                auVar52._28_4_ = auVar96._28_4_;
                local_2700 = vminps_avx(auVar52,auVar139);
                auVar88._8_4_ = 0x7f800000;
                auVar88._0_8_ = 0x7f8000007f800000;
                auVar88._12_4_ = 0x7f800000;
                auVar88._16_4_ = 0x7f800000;
                auVar88._20_4_ = 0x7f800000;
                auVar88._24_4_ = 0x7f800000;
                auVar88._28_4_ = 0x7f800000;
                auVar96 = vblendvps_avx(auVar88,local_26e0,auVar124);
                auVar13 = vshufps_avx(auVar96,auVar96,0xb1);
                auVar13 = vminps_avx(auVar96,auVar13);
                auVar24 = vshufpd_avx(auVar13,auVar13,5);
                auVar13 = vminps_avx(auVar13,auVar24);
                auVar24 = vpermpd_avx2(auVar13,0x4e);
                auVar13 = vminps_avx(auVar13,auVar24);
                auVar96 = vcmpps_avx(auVar96,auVar13,0);
                auVar13 = auVar124 & auVar96;
                if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar13 >> 0x7f,0) != '\0') ||
                      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar13 >> 0xbf,0) != '\0') ||
                    (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar13[0x1f] < '\0') {
                  auVar124 = vandps_avx(auVar96,auVar124);
                }
                uVar65 = vmovmskps_avx(auVar124);
                uVar66 = 0;
                for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                  uVar66 = uVar66 + 1;
                }
                uVar61 = (ulong)uVar66;
                local_28c0._0_8_ = local_2a18->args;
                if ((local_2a18->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar10->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  pRVar12 = local_2a18->user;
                  local_2920 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                  _local_2940 = local_26e0;
                  do {
                    local_28e4 = *(undefined4 *)(local_2720 + uVar61 * 4);
                    local_28e0 = *(undefined4 *)(local_2700 + uVar61 * 4);
                    (ray->super_RayK<1>).tfar = local_26c0[uVar61 - 8];
                    local_28f0 = local_26c0[uVar61];
                    local_28ec = local_26a0[uVar61];
                    local_28e8 = local_2680[uVar61];
                    local_28dc = (int)local_2a00;
                    local_28d8 = (int)local_2a10;
                    local_28d4 = pRVar12->instID[0];
                    local_28d0 = pRVar12->instPrimID[0];
                    local_2a04 = -1;
                    local_2970.valid = &local_2a04;
                    local_2970.geometryUserPtr = pGVar10->userPtr;
                    local_2970.context = pRVar12;
                    local_2970.ray = (RTCRayN *)ray;
                    local_2970.hit = (RTCHitN *)&local_28f0;
                    local_2970.N = 1;
                    if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0153d8d0:
                      if ((*(code **)(local_28c0._0_8_ + 0x10) != (code *)0x0) &&
                         (((*(byte *)local_28c0._0_8_ & 2) != 0 ||
                          (((pGVar10->field_8).field_0x2 & 0x40) != 0)))) {
                        (**(code **)(local_28c0._0_8_ + 0x10))(&local_2970);
                        auVar128 = ZEXT3264(_local_2940);
                        if (*local_2970.valid == 0) goto LAB_0153d972;
                      }
                      (((Vec3f *)((long)local_2970.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2970.hit;
                      (((Vec3f *)((long)local_2970.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2970.hit + 4);
                      (((Vec3f *)((long)local_2970.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2970.hit + 8);
                      *(float *)((long)local_2970.ray + 0x3c) = *(float *)(local_2970.hit + 0xc);
                      *(float *)((long)local_2970.ray + 0x40) = *(float *)(local_2970.hit + 0x10);
                      *(float *)((long)local_2970.ray + 0x44) = *(float *)(local_2970.hit + 0x14);
                      *(float *)((long)local_2970.ray + 0x48) = *(float *)(local_2970.hit + 0x18);
                      *(float *)((long)local_2970.ray + 0x4c) = *(float *)(local_2970.hit + 0x1c);
                      *(float *)((long)local_2970.ray + 0x50) = *(float *)(local_2970.hit + 0x20);
                    }
                    else {
                      (*pGVar10->intersectionFilterN)(&local_2970);
                      auVar128 = ZEXT3264(_local_2940);
                      if (*local_2970.valid != 0) goto LAB_0153d8d0;
LAB_0153d972:
                      (ray->super_RayK<1>).tfar = (float)local_2920._0_4_;
                    }
                    *(undefined4 *)(local_2820 + uVar61 * 4) = 0;
                    auVar13 = local_2820;
                    fVar110 = (ray->super_RayK<1>).tfar;
                    auVar80._4_4_ = fVar110;
                    auVar80._0_4_ = fVar110;
                    auVar80._8_4_ = fVar110;
                    auVar80._12_4_ = fVar110;
                    auVar80._16_4_ = fVar110;
                    auVar80._20_4_ = fVar110;
                    auVar80._24_4_ = fVar110;
                    auVar80._28_4_ = fVar110;
                    auVar96 = vcmpps_avx(auVar128._0_32_,auVar80,2);
                    auVar124 = vandps_avx(auVar96,local_2820);
                    local_2820 = auVar124;
                    auVar13 = auVar13 & auVar96;
                    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar13 >> 0x7f,0) == '\0') &&
                          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar13 >> 0xbf,0) == '\0') &&
                        (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar13[0x1f]) goto LAB_0153d72c;
                    local_2920 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                    auVar89._8_4_ = 0x7f800000;
                    auVar89._0_8_ = 0x7f8000007f800000;
                    auVar89._12_4_ = 0x7f800000;
                    auVar89._16_4_ = 0x7f800000;
                    auVar89._20_4_ = 0x7f800000;
                    auVar89._24_4_ = 0x7f800000;
                    auVar89._28_4_ = 0x7f800000;
                    auVar96 = vblendvps_avx(auVar89,auVar128._0_32_,auVar124);
                    auVar13 = vshufps_avx(auVar96,auVar96,0xb1);
                    auVar13 = vminps_avx(auVar96,auVar13);
                    auVar24 = vshufpd_avx(auVar13,auVar13,5);
                    auVar13 = vminps_avx(auVar13,auVar24);
                    auVar24 = vpermpd_avx2(auVar13,0x4e);
                    auVar13 = vminps_avx(auVar13,auVar24);
                    auVar96 = vcmpps_avx(auVar96,auVar13,0);
                    auVar13 = auVar124 & auVar96;
                    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar13 >> 0x7f,0) != '\0') ||
                          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar13 >> 0xbf,0) != '\0') ||
                        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar13[0x1f] < '\0') {
                      auVar124 = vandps_avx(auVar96,auVar124);
                    }
                    uVar54 = vmovmskps_avx(auVar124);
                    uVar53 = 0;
                    for (; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x80000000) {
                      uVar53 = uVar53 + 1;
                    }
                    uVar61 = (ulong)uVar53;
                  } while( true );
                }
                fVar110 = *(float *)(local_2720 + uVar61 * 4);
                fVar94 = *(float *)(local_2700 + uVar61 * 4);
                fVar101 = local_26c0[uVar61];
                fVar103 = local_26a0[uVar61];
                fVar105 = local_2680[uVar61];
                (ray->super_RayK<1>).tfar = local_26c0[uVar61 - 8];
                (ray->Ng).field_0.field_0.x = fVar101;
                (ray->Ng).field_0.field_0.y = fVar103;
                (ray->Ng).field_0.field_0.z = fVar105;
                ray->u = fVar110;
                ray->v = fVar94;
                ray->primID = uVar54;
                ray->geomID = uVar53;
                pRVar12 = local_2a18->user;
                ray->instID[0] = pRVar12->instID[0];
                ray->instPrimID[0] = pRVar12->instPrimID[0];
              }
            }
          }
LAB_0153d72c:
          auVar168 = ZEXT3264(local_2540);
          auVar173 = ZEXT3264(local_2560);
          auVar176 = ZEXT3264(local_2580);
          auVar171 = ZEXT3264(local_2860);
          auVar174 = ZEXT3264(local_2880);
          context = local_2a18;
          uVar61 = local_29a8;
          uVar67 = local_2a20;
          uVar62 = local_2998;
          pauVar68 = local_2990;
          uVar69 = local_29a0;
          uVar71 = local_29b8;
          uVar73 = local_29b0;
        }
      }
      auVar145 = ZEXT3264(local_25e0);
      auVar140 = ZEXT3264(local_2600);
      auVar156 = ZEXT3264(local_2640);
      auVar128 = ZEXT3264(local_2660);
      auVar118._0_4_ = local_2620;
      fVar110 = fStack_261c;
      fVar94 = fStack_2618;
      fVar101 = fStack_2614;
      fVar103 = fStack_2610;
      fVar105 = fStack_260c;
      fVar107 = fStack_2608;
    }
    fVar111 = (ray->super_RayK<1>).tfar;
    local_28a0._4_4_ = fVar111;
    local_28a0._0_4_ = fVar111;
    local_28a0._8_4_ = fVar111;
    local_28a0._12_4_ = fVar111;
    local_28a0._16_4_ = fVar111;
    local_28a0._20_4_ = fVar111;
    local_28a0._24_4_ = fVar111;
    local_28a0._28_4_ = fVar111;
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }